

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O3

void __thiscall
chrono::geometry::ChGeometry::GetBoundingBox
          (ChGeometry *this,ChVector<double> *cmin,ChVector<double> *cmax,ChMatrix33<double> *rot)

{
  cmin->m_data[2] = 0.0;
  cmin->m_data[0] = 0.0;
  cmin->m_data[1] = 0.0;
  cmax->m_data[2] = 0.0;
  cmax->m_data[0] = 0.0;
  cmax->m_data[1] = 0.0;
  return;
}

Assistant:

inline ChVector<Real>& ChVector<Real>::operator=(const ChVector<Real>& other) {
    if (&other == this)
        return *this;
    m_data[0] = other.m_data[0];
    m_data[1] = other.m_data[1];
    m_data[2] = other.m_data[2];
    return *this;
}